

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.c
# Opt level: O2

int ThreadPoolSetAttr(ThreadPool *tp,ThreadPoolAttr *attr)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  size_t sVar5;
  PolicyType in;
  undefined4 uVar6;
  undefined8 local_58;
  undefined8 local_48;
  
  if (tp == (ThreadPool *)0x0) {
    iVar4 = 0x16;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)tp);
    if (attr == (ThreadPoolAttr *)0x0) {
      local_48 = 0xa00000001;
      in = 0;
      uVar6 = 0;
      local_58 = 0xa00002710;
      piVar3 = &maxJobsTotal;
      iVar4 = 500;
      sVar5 = 0;
    }
    else {
      local_48._0_4_ = attr->minThreads;
      local_48._4_4_ = attr->maxThreads;
      sVar5 = attr->stackSize;
      local_58._0_4_ = attr->maxIdleTime;
      local_58._4_4_ = attr->jobsPerThread;
      piVar3 = &attr->maxJobsTotal;
      iVar4 = attr->starvationTime;
      in = attr->schedPolicy;
      uVar6 = *(undefined4 *)&attr->field_0x24;
    }
    iVar2 = *piVar3;
    iVar1 = SetPolicyType(in);
    if (iVar1 == 0) {
      (tp->attr).minThreads = (int)local_48;
      (tp->attr).maxThreads = local_48._4_4_;
      (tp->attr).stackSize = sVar5;
      (tp->attr).maxIdleTime = (undefined4)local_58;
      (tp->attr).jobsPerThread = local_58._4_4_;
      (tp->attr).maxJobsTotal = iVar2;
      (tp->attr).starvationTime = iVar4;
      *(ulong *)&(tp->attr).schedPolicy = CONCAT44(uVar6,in);
      iVar2 = 0;
      if (tp->totalThreads < (int)local_48) {
        iVar4 = tp->totalThreads + -1;
        do {
          iVar4 = iVar4 + 1;
          if ((tp->attr).minThreads <= iVar4) {
            iVar2 = 0;
            break;
          }
          iVar2 = CreateWorker(tp);
        } while (iVar2 == 0);
      }
      pthread_cond_signal((pthread_cond_t *)&tp->condition);
      pthread_mutex_unlock((pthread_mutex_t *)tp);
      iVar4 = 0;
      if (iVar2 != 0) {
        ThreadPoolShutdown(tp);
        iVar4 = iVar2;
      }
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)tp);
      iVar4 = 0x20000000;
    }
  }
  return iVar4;
}

Assistant:

int ThreadPoolSetAttr(ThreadPool *tp, ThreadPoolAttr *attr)
{
	int retCode = 0;
	ThreadPoolAttr temp;
	int i = 0;

	if (!tp)
		return EINVAL;

	ithread_mutex_lock(&tp->mutex);

	if (attr)
		temp = *attr;
	else
		TPAttrInit(&temp);
	if (SetPolicyType(temp.schedPolicy) != 0) {
		ithread_mutex_unlock(&tp->mutex);
		return INVALID_POLICY;
	}
	tp->attr = temp;
	/* add threads */
	if (tp->totalThreads < tp->attr.minThreads) {
		for (i = tp->totalThreads; i < tp->attr.minThreads; i++) {
			retCode = CreateWorker(tp);
			if (retCode != 0) {
				break;
			}
		}
	}
	/* signal changes */
	ithread_cond_signal(&tp->condition);

	ithread_mutex_unlock(&tp->mutex);

	if (retCode != 0)
		/* clean up if the min threads could not be created */
		ThreadPoolShutdown(tp);

	return retCode;
}